

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void licm_add_loop_preheaders(gen_ctx_t gen_ctx,loop_node_t_conflict loop)

{
  void **ppvVar1;
  char cVar2;
  uint32_t uVar3;
  bb_insn_t pbVar4;
  bb_t pbVar5;
  bb_t_conflict pbVar6;
  bb_insn_t_conflict bb_insn;
  FILE *__s;
  gen_ctx *pgVar7;
  VARR_size_t *pVVar8;
  bitmap_t pVVar9;
  uint *puVar10;
  int iVar11;
  in_edge_t_conflict peVar12;
  gen_ctx *pgVar13;
  gen_ctx *pgVar14;
  void *pvVar15;
  ulong uVar16;
  long *plVar17;
  uint uVar18;
  gen_ctx *pgVar19;
  MIR_insn_t pMVar20;
  bb_t pbVar21;
  MIR_insn_t pMVar22;
  ulong uVar23;
  bb_insn_t pbVar24;
  DLIST_LINK_bb_insn_t *pDVar25;
  gen_ctx *extraout_RDX;
  bitmap_t extraout_RDX_00;
  uint *extraout_RDX_01;
  ulong uVar26;
  undefined8 *puVar27;
  gen_ctx *pgVar28;
  MIR_context_t pMVar29;
  ulong uVar30;
  MIR_context_t pMVar31;
  gen_ctx *loop_00;
  loop_node_t_conflict after;
  char *pcVar32;
  gen_ctx_t gen_ctx_00;
  gen_ctx *pgVar33;
  gen_ctx *gen_ctx_01;
  bb_insn_t_conflict bb_insn_00;
  long lVar34;
  ulong nop;
  loop_node_t loop_01;
  edge_t_conflict e;
  bool bVar35;
  undefined1 auVar36 [32];
  int iStack_160;
  MIR_reg_t MStack_15c;
  ulong uStack_158;
  insn_var_iterator_t iStack_150;
  gen_ctx_t pgStack_130;
  bb_insn_t_conflict pbStack_128;
  gen_ctx *pgStack_120;
  gen_ctx *pgStack_118;
  gen_ctx *pgStack_110;
  gen_ctx *pgStack_108;
  code *pcStack_100;
  code *pcStack_f8;
  gen_ctx *pgStack_e8;
  gen_ctx *pgStack_e0;
  undefined4 uStack_d4;
  gen_ctx *pgStack_d0;
  gen_ctx *pgStack_c8;
  MIR_context_t pMStack_c0;
  gen_ctx *pgStack_b8;
  bb_insn_t_conflict pbStack_b0;
  undefined1 auStack_a4 [20];
  MIR_insn_t_conflict pMStack_90;
  bb_insn_t_conflict pbStack_88;
  MIR_op_t *pMStack_80;
  long *plStack_78;
  MIR_context_t pMStack_70;
  gen_ctx_t pgStack_68;
  gen_ctx *pgStack_60;
  gen_ctx *pgStack_58;
  loop_node_t_conflict plStack_50;
  edge_t_conflict peStack_48;
  gen_ctx *pgStack_40;
  
  loop_01 = (loop->children).head;
  if (loop_01 != (loop_node_t)0x0) {
    bVar35 = true;
    do {
      while (loop_01->bb == (bb_t)0x0) {
        pgStack_40 = (gen_ctx *)0x168268;
        licm_add_loop_preheaders(gen_ctx,loop_01);
        loop_01 = (loop_01->children_link).next;
        bVar35 = false;
        if (loop_01 == (loop_node_t)0x0) {
          return;
        }
      }
      loop_01 = (loop_01->children_link).next;
    } while (loop_01 != (loop_node_t)0x0);
    if (!bVar35) {
      return;
    }
  }
  if (gen_ctx->curr_cfg->root_loop_node == loop) {
    return;
  }
  (loop->u).preheader = (loop_node_t)0x0;
  peVar12 = (loop->entry->bb->in_edges).head;
  if (peVar12 == (in_edge_t_conflict)0x0) {
    return;
  }
  e = (edge_t_conflict)0x0;
  do {
    if ((peVar12->back_edge_p == '\0') && (bVar35 = e != (edge_t_conflict)0x0, e = peVar12, bVar35))
    {
      return;
    }
    peVar12 = (peVar12->in_link).next;
  } while (peVar12 != (in_edge_t)0x0);
  if (e == (edge_t_conflict)0x0) {
    return;
  }
  pbVar4 = (e->src->bb_insns).tail;
  pbVar24 = (e->dst->bb_insns).head;
  if (pbVar24 == (bb_insn_t)0x0 || pbVar4 == (bb_insn_t)0x0) {
    if (pbVar4 == (bb_insn_t)0x0) goto LAB_0016830e;
  }
  else if ((pbVar4->insn->insn_link).next != pbVar24->insn) {
    return;
  }
  iVar11 = (int)*(undefined8 *)&pbVar4->insn->field_0x18;
  if ((iVar11 == 0x76) || (((iVar11 - 0xa5U < 0xffffffd1 && (iVar11 != 0xa6)) && (iVar11 != 0xaa))))
  {
LAB_0016830e:
    loop->u = (anon_union_8_2_35464522_for_u)e->src->loop_node;
    (e->src->loop_node->u).preheader = loop;
    return;
  }
  pgStack_40 = (gen_ctx *)0x16835b;
  pgVar13 = (gen_ctx *)create_bb(gen_ctx,(MIR_insn_t)0x0);
  pgStack_40 = (gen_ctx *)0x16836b;
  pgVar14 = (gen_ctx *)gen_malloc(gen_ctx,0x50);
  uVar3 = gen_ctx->curr_loop_node_index;
  gen_ctx->curr_loop_node_index = uVar3 + 1;
  *(uint32_t *)&pgVar14->ctx = uVar3;
  *(gen_ctx **)&pgVar14->optimize_level = pgVar13;
  if (pgVar13 != (gen_ctx *)0x0) {
    pgVar13->call_used_hard_regs[6] = (bitmap_t)pgVar14;
  }
  pgVar14->insn_to_consider = (bitmap_t)0x0;
  *(char **)&pgVar14->addr_insn_p = (char *)0x0;
  auVar36 = ZEXT1632(ZEXT816(0) << 0x40);
  pgVar14->curr_func_item = (MIR_item_t)auVar36._0_8_;
  pgVar14->debug_file = (FILE *)auVar36._8_8_;
  pgVar14->debug_level = auVar36._16_4_;
  *(int *)&pgVar14->field_0x24 = auVar36._20_4_;
  pgVar14->to_free = (VARR_void_ptr_t *)auVar36._24_8_;
  pgVar28 = (gen_ctx *)loop->parent;
  pgStack_40 = (gen_ctx *)0x1683b8;
  loop_00 = pgVar13;
  gen_ctx_00 = gen_ctx;
  add_new_bb(gen_ctx,(bb_t_conflict)pgVar13);
  pbVar5 = (bb_t)gen_ctx->curr_cfg;
  pbVar6 = *(bb_t_conflict *)&pgVar13->debug_level;
  if (pbVar6 == (bb_t_conflict)0x0) {
    if ((gen_ctx *)pbVar5->bfs == pgVar13) {
      pbVar21 = (bb_t)pgVar13->to_free;
      pbVar5->bfs = (size_t)pbVar21;
      goto LAB_001683e7;
    }
    pgStack_40 = (gen_ctx *)0x1684ec;
    licm_add_loop_preheaders_cold_1();
  }
  else {
    pbVar21 = (bb_t)pgVar13->to_free;
    (pbVar6->bb_link).next = pbVar21;
LAB_001683e7:
    if ((pbVar21 != (bb_t)0x0) || (pbVar21 = pbVar5, (gen_ctx *)(pbVar5->bb_link).prev == pgVar13))
    {
      (pbVar21->bb_link).prev = pbVar6;
      *(VARR_size_t **)&pgVar13->debug_level = (VARR_size_t *)0x0;
      pgVar13->to_free = (VARR_void_ptr_t *)0x0;
      pgStack_40 = (gen_ctx *)0x16842c;
      DLIST_bb_t_insert_before(&gen_ctx->curr_cfg->bbs,e->dst,(bb_t_conflict)pgVar13);
      if (pgVar28 == (gen_ctx *)0x0) {
        pgStack_40 = (gen_ctx *)0x1684e7;
        __assert_fail("parent != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x147d,"void create_preheader_from_edge(gen_ctx_t, edge_t, loop_node_t)");
      }
      pbVar5 = (e->dst->bb_link).prev;
      if ((pbVar5 == (bb_t)0x0) || (after = pbVar5->loop_node, (gen_ctx *)after->parent != pgVar28))
      {
        after = e->src->loop_node;
        if ((gen_ctx *)after->parent != pgVar28) {
          pgStack_40 = (gen_ctx *)0x16846b;
          DLIST_loop_node_t_append
                    ((DLIST_loop_node_t *)&pgVar28->to_free,(loop_node_t_conflict)pgVar14);
          goto LAB_00168479;
        }
      }
      pgStack_40 = (gen_ctx *)0x168479;
      DLIST_loop_node_t_insert_after
                ((DLIST_loop_node_t *)&pgVar28->to_free,after,(loop_node_t_conflict)pgVar14);
LAB_00168479:
      pgVar14->debug_file = (FILE *)pgVar28;
      *(loop_node_t_conflict *)&pgVar14->debug_level = loop;
      (loop->u).preheader = (loop_node_t)pgVar14;
      pgStack_40 = (gen_ctx *)0x16849b;
      create_edge(gen_ctx,e->src,(bb_t_conflict)pgVar13,1,0);
      pgStack_40 = (gen_ctx *)0x1684b2;
      create_edge(gen_ctx,(bb_t_conflict)pgVar13,e->dst,1,0);
      delete_edge(e);
      return;
    }
  }
  pgStack_40 = (gen_ctx *)loop_licm;
  licm_add_loop_preheaders_cold_2();
  pgStack_e8 = (gen_ctx *)gen_ctx_00->temp_bitmap;
  pgVar19 = (gen_ctx *)gen_ctx_00->temp_bitmap2;
  bb_insn_00 = (bb_insn_t_conflict)gen_ctx_00->temp_bb_insns;
  pgVar33 = (gen_ctx *)loop_00->to_free;
  pcVar32 = (char *)loop_00;
  pgStack_c8 = pgVar19;
  pgStack_68 = gen_ctx;
  pgStack_60 = pgVar13;
  pgStack_58 = pgVar14;
  plStack_50 = loop;
  peStack_48 = e;
  pgStack_40 = pgVar28;
  if (pgVar33 == (gen_ctx *)0x0) {
    uStack_d4 = 0;
  }
  else {
    bVar35 = true;
    uStack_d4 = 0;
    do {
      while (*(c2mir_ctx **)&pgVar33->optimize_level == (c2mir_ctx *)0x0) {
        pcStack_f8 = (code *)0x168556;
        pcVar32 = (char *)pgVar33;
        iVar11 = loop_licm(gen_ctx_00,(loop_node_t_conflict)pgVar33);
        pgVar33 = (gen_ctx *)pgVar33->addr_regs;
        if (iVar11 != 0) {
          uStack_d4 = 1;
        }
        bVar35 = false;
        if (pgVar33 == (gen_ctx *)0x0) {
          return;
        }
      }
      pgVar33 = (gen_ctx *)pgVar33->addr_regs;
    } while (pgVar33 != (gen_ctx *)0x0);
    pgVar28 = (gen_ctx *)&DAT_00000001;
    if (!bVar35) {
      return;
    }
  }
  pgVar13 = (gen_ctx *)0x0;
  if ((gen_ctx *)gen_ctx_00->curr_cfg->root_loop_node == loop_00) {
    return;
  }
  if (*(VARR_size_t **)&loop_00->debug_level == (VARR_size_t *)0x0) {
    return;
  }
  pgVar33 = (gen_ctx *)gen_ctx_00->debug_file;
  if ((pgVar33 != (gen_ctx *)0x0) && (1 < gen_ctx_00->debug_level)) {
    pcVar32 = "Processing Loop%3lu for loop invariant motion:\n";
    pcStack_f8 = (code *)0x1685c0;
    fprintf((FILE *)pgVar33,"Processing Loop%3lu for loop invariant motion:\n",
            (ulong)*(uint *)&loop_00->ctx);
  }
  pgVar7 = pgStack_e8;
  if ((bb_insn_00 == (bb_insn_t_conflict)0x0) || (*(long *)&bb_insn_00->mem_index == 0)) {
LAB_00168f2f:
    pcStack_f8 = (code *)0x168f34;
    loop_licm_cold_12();
    gen_ctx_01 = pgVar33;
LAB_00168f34:
    pcStack_f8 = (code *)0x168f39;
    loop_licm_cold_11();
  }
  else {
    bb_insn_00->insn = (MIR_insn_t)0x0;
    gen_ctx_01 = pgVar33;
    if ((pgStack_e8 == (gen_ctx *)0x0) || (pgStack_e8->curr_func_item == (MIR_item_t)0x0))
    goto LAB_00168f34;
    pgStack_e8->ctx = (MIR_context_t)0x0;
    pgVar13 = (gen_ctx *)loop_00->to_free;
    pbStack_b0 = bb_insn_00;
    if (pgVar13 == (gen_ctx *)0x0) {
LAB_00168897:
      pgVar28 = (gen_ctx *)0x0;
    }
    else {
      do {
        pgStack_e0 = pgVar13;
        if (*(c2mir_ctx **)&pgVar13->optimize_level != (c2mir_ctx *)0x0) {
          for (puVar27 = *(undefined8 **)(*(c2mir_ctx **)&pgVar13->optimize_level + 0x50);
              puVar27 != (undefined8 *)0x0; puVar27 = (undefined8 *)puVar27[5]) {
            pgVar19 = (gen_ctx *)0x0;
            pcStack_f8 = (code *)0x168644;
            pcVar32 = (char *)loop_00;
            pgVar33 = gen_ctx_00;
            iVar11 = loop_invariant_p(gen_ctx_00,(loop_node_t_conflict)loop_00,
                                      (bb_insn_t_conflict)*puVar27,(bitmap_t)0x0);
            if (iVar11 != 0) {
              pvVar15 = *(void **)&bb_insn_00->mem_index;
              if (pvVar15 == (void *)0x0) goto LAB_00168ece;
              pMVar22 = bb_insn_00->insn;
              pMVar20 = (MIR_insn_t)((long)&pMVar22->data + 1);
              if (*(MIR_insn_t *)&bb_insn_00->gvn_val_const_p < pMVar20) {
                lVar34 = (long)pMVar20->ops + (((ulong)pMVar20 >> 1) - 0x20);
                pcStack_f8 = (code *)0x16867e;
                pvVar15 = realloc(pvVar15,lVar34 * 8);
                *(void **)&bb_insn_00->mem_index = pvVar15;
                *(long *)&bb_insn_00->gvn_val_const_p = lVar34;
                pMVar22 = bb_insn_00->insn;
                pMVar20 = (MIR_insn_t)((long)&pMVar22->data + 1);
              }
              bb_insn_00->insn = pMVar20;
              *(undefined8 **)((long)pvVar15 + (long)pMVar22 * 8) = puVar27;
              uVar18 = *(uint *)((long)puVar27 + 0xc);
              pgVar14 = (gen_ctx *)(ulong)uVar18;
              pcVar32 = (char *)((long)&pgVar14->ctx + 1);
              pcStack_f8 = (code *)0x1686a8;
              pgVar33 = pgVar7;
              bitmap_expand((bitmap_t)pgVar7,(size_t)pcVar32);
              pgVar19 = (gen_ctx *)(ulong)(uVar18 >> 6);
              ppvVar1 = &pgVar7->curr_func_item->data + (long)pgVar19;
              *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)pgVar14 & 0x3f));
            }
          }
        }
        pgVar13 = (gen_ctx *)pgStack_e0->addr_regs;
      } while (pgVar13 != (gen_ctx *)0x0);
      if (bb_insn_00->insn == (MIR_insn_t)0x0) goto LAB_00168897;
      pgVar19 = (gen_ctx *)0x0;
      pgVar13 = pgStack_e8;
      do {
        if (*(long *)&bb_insn_00->mem_index == 0) goto LAB_00168efc;
        pgStack_e0 = (gen_ctx *)
                     **(undefined8 **)(*(long *)&bb_insn_00->mem_index + (long)pgVar19 * 8);
        pgStack_d0 = (gen_ctx *)((ulong)pgStack_e0->debug_file >> 0x20);
        pgStack_b8 = pgVar19;
        if (pgStack_d0 != (gen_ctx *)0x0) {
          pgVar14 = (gen_ctx *)0x0;
          pMStack_c0 = (MIR_context_t)&pgStack_e0->debug_level;
          do {
            while( true ) {
              pgVar33 = (gen_ctx *)gen_ctx_00->ctx;
              pcStack_f8 = (code *)0x168747;
              pcVar32 = (char *)pgStack_e0;
              MIR_insn_op_mode((MIR_context_t)pgVar33,(MIR_insn_t_conflict)pgStack_e0,
                               (size_t)pgVar14,(int *)auStack_a4);
              if (auStack_a4._0_4_ != 0) break;
LAB_0016876f:
              pgVar14 = (gen_ctx *)((long)&pgVar14->ctx + 1);
              if (pgStack_d0 <= pgVar14) goto LAB_00168880;
            }
            cVar2 = *(char *)&((DLIST_LINK_MIR_insn_t *)&pMStack_c0->c2mir_ctx)[(long)pgVar14 * 3].
                              prev;
            if (cVar2 != '\x02') {
              if (cVar2 == '\v') goto LAB_0016876f;
              goto LAB_00168ed3;
            }
            for (pgVar28 = (&pMStack_c0->gen_ctx)[(long)(int)pgVar14 * 6]; pgVar28 != (gen_ctx *)0x0
                ; pgVar28 = *(gen_ctx **)&pgVar28->debug_level) {
              pcStack_f8 = (code *)0x1687ab;
              pcVar32 = (char *)loop_00;
              pgVar33 = gen_ctx_00;
              iVar11 = loop_invariant_p(gen_ctx_00,(loop_node_t_conflict)loop_00,
                                        (bb_insn_t_conflict)pgVar28->ctx->gen_ctx,(bitmap_t)pgVar13)
              ;
              if (iVar11 != 0) {
                uVar18 = *(uint *)((long)&pgVar28->ctx->c2mir_ctx + 4);
                uVar30 = (ulong)uVar18;
                pcStack_f8 = (code *)0x1687c9;
                pgVar33 = pgStack_e8;
                bitmap_expand((bitmap_t)pgStack_e8,uVar30 + 1);
                uVar18 = uVar18 >> 6;
                pvVar15 = (&pgStack_e8->curr_func_item->data)[uVar18];
                pcVar32 = (char *)((ulong)pvVar15 | 1L << (uVar30 & 0x3f));
                (&pgStack_e8->curr_func_item->data)[uVar18] = pcVar32;
                pgVar13 = pgStack_e8;
                if (((ulong)pvVar15 >> (uVar30 & 0x3f) & 1) == 0) {
                  pgVar13 = *(gen_ctx **)&bb_insn_00->mem_index;
                  if (pgVar13 == (gen_ctx *)0x0) {
                    pcStack_f8 = (code *)0x168ece;
                    loop_licm_cold_2();
                    goto LAB_00168ece;
                  }
                  pMVar22 = bb_insn_00->insn;
                  pMVar29 = pgVar28->ctx;
                  pMVar20 = (MIR_insn_t)((long)&pMVar22->data + 1);
                  if (*(MIR_insn_t *)&bb_insn_00->gvn_val_const_p < pMVar20) {
                    lVar34 = (long)pMVar20->ops + (((ulong)pMVar20 >> 1) - 0x20);
                    pcVar32 = (char *)(lVar34 * 8);
                    pcStack_f8 = (code *)0x168832;
                    pgVar33 = pgVar13;
                    pgVar13 = (gen_ctx *)realloc(pgVar13,(size_t)pcVar32);
                    *(gen_ctx **)&pbStack_b0->mem_index = pgVar13;
                    *(long *)&pbStack_b0->gvn_val_const_p = lVar34;
                    pMVar22 = pbStack_b0->insn;
                    pMVar20 = (MIR_insn_t)((long)&pMVar22->data + 1);
                    bb_insn_00 = pbStack_b0;
                  }
                  bb_insn_00->insn = pMVar20;
                  pgVar13->call_used_hard_regs[(long)&pMVar22[-1].ops[0].u.reg + 0x13] =
                       (bitmap_t)pMVar29;
                  pgVar13 = pgStack_e8;
                }
              }
            }
            pgVar14 = (gen_ctx *)((long)&pgVar14->ctx + 1);
          } while (pgVar14 < pgStack_d0);
        }
LAB_00168880:
        pgVar14 = (gen_ctx *)auStack_a4;
        pgVar28 = (gen_ctx *)bb_insn_00->insn;
        pgVar19 = (gen_ctx *)((long)&pgStack_b8->ctx + 1);
      } while (pgVar19 < pgVar28);
    }
    gen_ctx_01 = pgVar33;
    pgVar13 = pgStack_c8;
    if ((pgStack_c8 != (gen_ctx *)0x0) && (pgStack_c8->curr_func_item != (MIR_item_t)0x0)) {
      pgStack_c8->ctx = (MIR_context_t)0x0;
      if (0 < (int)(uint)pgVar28) {
        pMVar29 = (MIR_context_t)(ulong)((uint)pgVar28 & 0x7fffffff);
        do {
          if ((*(long *)&bb_insn_00->mem_index == 0) ||
             (pMVar31 = (MIR_context_t)((long)&pMVar29[-1].wrapper_end_addr + 7),
             (MIR_context_t)bb_insn_00->insn <= pMVar31)) {
            pcStack_f8 = (code *)0x168ef7;
            loop_licm_cold_9();
            goto LAB_00168ef7;
          }
          bb_insn = *(bb_insn_t_conflict *)(*(long *)&bb_insn_00->mem_index + (long)pMVar31 * 8);
          pgStack_e0 = (gen_ctx *)bb_insn->insn;
          if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
            pcStack_f8 = (code *)0x168919;
            fwrite("  Considering invariant ",0x18,1,(FILE *)gen_ctx_00->debug_file);
            pcStack_f8 = (code *)0x168926;
            print_bb_insn(gen_ctx_00,bb_insn,0);
            pgVar13 = pgStack_c8;
          }
          pgVar14 = pgStack_e8;
          uVar18 = bb_insn->index;
          if (((ulong)uVar18 < (ulong)((long)pgVar13->ctx << 6)) &&
             (((ulong)(&pgVar13->curr_func_item->data)[uVar18 >> 6] >> ((ulong)uVar18 & 0x3f) & 1)
              != 0)) {
            if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
              pcStack_f8 = (code *)0x16897d;
              fwrite("     -- already marked as moved\n",0x20,1,(FILE *)gen_ctx_00->debug_file);
            }
          }
          else {
            pMStack_c0 = pMVar31;
            if (((uint)pgStack_e0->debug_file & 0xfffffffe) == 0x2c) {
              if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) && (1 < gen_ctx_00->debug_level))
              {
                pcStack_f8 = (code *)0x1689c7;
                fwrite("     -- marked as moved becuase it is costly\n",0x2d,1,
                       (FILE *)gen_ctx_00->debug_file);
              }
              pgVar13 = pgStack_c8;
              pcStack_f8 = (code *)0x1689dd;
              mark_as_moved(gen_ctx_00,bb_insn,(bitmap_t)pgVar14,(bitmap_t)pgStack_c8);
              pMVar31 = pMStack_c0;
            }
            else {
              uVar30 = (ulong)pgStack_e0->debug_file >> 0x20;
              pgVar13 = (gen_ctx *)0x0;
              pbStack_88 = bb_insn;
              pMStack_70 = pMVar29;
              if (uVar30 != 0) {
                uVar26 = 0;
                nop = 0;
                pgStack_d0 = (gen_ctx *)&pgStack_e0->debug_level;
                pgVar13 = (gen_ctx *)0x0;
LAB_00168a1b:
                do {
                  pgStack_b8 = pgVar13;
                  pcStack_f8 = (code *)0x168a30;
                  MIR_insn_op_mode(gen_ctx_00->ctx,(MIR_insn_t_conflict)pgStack_e0,nop,
                                   (int *)(auStack_a4 + 4));
                  if ((auStack_a4._4_4_ == 0) ||
                     (uVar16 = uVar26,
                     *(char *)(pgStack_d0->call_used_hard_regs + nop * 6 + -0xc) == '\v')) {
                    if (uVar26 < 2) {
                      uVar23 = uVar26;
                      do {
                        if (*(char *)(pgStack_d0->call_used_hard_regs + nop * 6 + -0xc) != '\v') {
                          if (uVar26 != 1) {
                            uVar16 = 0;
                            uVar23 = uVar26;
                            if (*(char *)(pgStack_d0->call_used_hard_regs + nop * 6 + -0xc) !=
                                '\x02') goto LAB_00168a94;
LAB_00168aab:
                            if ((_IO_FILE *)
                                pgStack_d0->call_used_hard_regs[(long)(int)nop * 6 + -0xd] ==
                                (_IO_FILE *)0x0) goto LAB_00168b36;
                            plVar17 = (long *)((_IO_FILE *)
                                              pgStack_d0->call_used_hard_regs
                                              [(long)(int)nop * 6 + -0xd])->_IO_read_ptr;
                            uVar26 = (ulong)*(uint *)((long)plVar17 + 0xc);
                            if ((((ulong)((long)pgStack_e8->ctx << 6) <= uVar26) ||
                                (uVar18 = *(uint *)((long)plVar17 + 0xc) >> 6,
                                ((ulong)(&pgStack_e8->curr_func_item->data)[uVar18] >>
                                 (uVar26 & 0x3f) & 1) == 0)) ||
                               ((uVar26 < (ulong)((long)pgStack_c8->ctx << 6) &&
                                (((ulong)(&pgStack_c8->curr_func_item->data)[uVar18] &
                                 1L << (uVar26 & 0x3f)) != 0)))) goto LAB_00168b36;
                            pMStack_90 = (MIR_insn_t_conflict)*plVar17;
                            auStack_a4._12_8_ = *(ulong *)&pMStack_90->field_0x18 >> 0x20;
                            if ((gen_ctx *)auStack_a4._12_8_ == (gen_ctx *)0x0) goto LAB_00168b36;
                            pgVar13 = (gen_ctx *)0x0;
                            pMStack_80 = pMStack_90->ops;
                            plStack_78 = plVar17;
                            goto LAB_00168b61;
                          }
                          break;
                        }
                        if (*(int *)((long)pgStack_d0->call_used_hard_regs +
                                    (ulong)(uVar23 != 0) * 4 + nop * 0x30 + -0x48) != -1)
                        goto LAB_00168aab;
                        bVar35 = uVar23 == 0;
                        uVar23 = 1;
                      } while (bVar35);
                    }
                    uVar16 = 0;
                  }
LAB_00168a94:
                  nop = nop + 1;
                  pgVar13 = pgStack_b8;
                  uVar26 = uVar16;
                } while (nop < uVar30);
              }
LAB_00168c1c:
              iVar11 = (int)pgVar13;
              bVar35 = true;
LAB_00168c1f:
              pMVar29 = pMStack_70;
              __s = (FILE *)gen_ctx_00->debug_file;
              if ((__s != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
                if (iVar11 == 0) {
                  pcStack_f8 = (code *)0x168cba;
                  fwrite("     -- can\'t be moved because single insn\n",0x2b,1,__s);
                  pMVar31 = pMStack_c0;
                  pgVar13 = pgStack_c8;
                  goto LAB_00168c98;
                }
                pcVar32 = "can\'t";
                if (bVar35) {
                  pcVar32 = "can";
                }
                pcStack_f8 = (code *)0x168c68;
                fprintf(__s,"     -- %s be moved because reg presure consideration\n",pcVar32);
              }
              pMVar31 = pMStack_c0;
              pgVar13 = pgStack_c8;
              if (bVar35 && iVar11 != 0) {
                pcStack_f8 = (code *)0x168c98;
                mark_as_moved(gen_ctx_00,pbStack_88,(bitmap_t)pgStack_e8,(bitmap_t)pgStack_c8);
              }
            }
          }
LAB_00168c98:
          bVar35 = 1 < (long)pMVar29;
          pMVar29 = pMVar31;
        } while (bVar35);
        pgVar28 = (gen_ctx *)bb_insn_00->insn;
      }
      if (pgVar28 != (gen_ctx *)0x0) {
        pgVar14 = (gen_ctx *)0x0;
        do {
          if (*(long *)&bb_insn_00->mem_index == 0) {
LAB_00168ef7:
            pcStack_f8 = (code *)0x168efc;
            loop_licm_cold_8();
LAB_00168efc:
            pcStack_f8 = (code *)0x168f01;
            loop_licm_cold_3();
LAB_00168f01:
            pcStack_f8 = (code *)0x168f20;
            __assert_fail("before != ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x14d2,"void licm_move_insn(gen_ctx_t, bb_insn_t, bb_t, bb_insn_t)");
          }
          bb_insn_00 = *(bb_insn_t_conflict *)(*(long *)&bb_insn_00->mem_index + (long)pgVar14 * 8);
          uVar18 = bb_insn_00->index;
          if (((ulong)uVar18 < (ulong)((long)pgStack_c8->ctx << 6)) &&
             (((ulong)(&pgStack_c8->curr_func_item->data)[uVar18 >> 6] >> ((ulong)uVar18 & 0x3f) & 1
              ) != 0)) {
            if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
              pcStack_f8 = (code *)0x168d4b;
              fprintf((FILE *)gen_ctx_00->debug_file,"  Move invariant (target bb%lu) %-5lu",
                      *(undefined8 *)(*(VARR_size_t **)&loop_00->debug_level)->size);
              pcStack_f8 = (code *)0x168d58;
              print_bb_insn(gen_ctx_00,bb_insn_00,0);
            }
            pgVar13 = (gen_ctx *)loop_00->curr_func_item->module[1].items.tail;
            if (pgVar13 == (gen_ctx *)0x0) goto LAB_00168f01;
            pMVar29 = gen_ctx_00->ctx;
            pcVar32 = (char *)bb_insn_00->insn;
            pgVar19 = (gen_ctx *)bb_insn_00->bb;
            pgVar33 = (gen_ctx *)(*(VARR_size_t **)&loop_00->debug_level)->size;
            pbVar4 = (bb_insn_00->bb_insn_link).prev;
            pgVar7 = (gen_ctx *)pgVar33->temp_bitmap2;
            if (pbVar4 == (bb_insn_t)0x0) {
              if ((bb_insn_t_conflict)((MIR_module *)&pgVar19->temp_bitmap)->data == bb_insn_00) {
                pbVar24 = (bb_insn_00->bb_insn_link).next;
                ((MIR_module *)&pgVar19->temp_bitmap)->data = pbVar24;
                goto LAB_00168dad;
              }
LAB_00168f25:
              pcStack_f8 = (code *)0x168f2a;
              loop_licm_cold_4();
            }
            else {
              pbVar24 = (bb_insn_00->bb_insn_link).next;
              (pbVar4->bb_insn_link).next = pbVar24;
LAB_00168dad:
              pgStack_e8 = pgVar7;
              pMStack_c0 = pMVar29;
              if (pbVar24 != (bb_insn_t)0x0) {
                pDVar25 = &pbVar24->bb_insn_link;
LAB_00168dd3:
                pDVar25->prev = pbVar4;
                pgVar28 = (gen_ctx *)&pgVar33->temp_bitmap;
                bb_insn_00->bb_insn_link = (DLIST_LINK_bb_insn_t)(ZEXT816(0) << 0x40);
                gen_ctx_01 = (gen_ctx *)&((gen_ctx_00->curr_func_item->u).func)->insns;
                pcStack_f8 = (code *)0x168e02;
                pgStack_e0 = pgVar33;
                pgStack_d0 = (gen_ctx *)pcVar32;
                DLIST_MIR_insn_t_remove((DLIST_MIR_insn_t *)gen_ctx_01,(MIR_insn_t)pcVar32);
                pgVar33 = pgStack_e8;
                if ((pgStack_e8 == (gen_ctx *)0x0) ||
                   (pgStack_e8->ctx->func_redef_permission_p != 0x76)) {
                  pbVar4 = (bb_insn_t)pgStack_e0->temp_bitmap2;
                  pgVar19 = pgStack_d0;
                  pcVar32 = (char *)pgStack_e8;
                  if (pbVar4 == (bb_insn_t)0x0) {
                    if ((char *)((MIR_module *)pgVar28)->data != (char *)0x0) goto LAB_00168f3e;
                  }
                  else {
                    if ((pbVar4->bb_insn_link).next != (bb_insn_t)0x0) {
                      pcStack_f8 = (code *)0x168f25;
                      loop_licm_cold_6();
                      pgVar33 = gen_ctx_01;
                      goto LAB_00168f25;
                    }
                    pgVar28 = (gen_ctx *)&(pbVar4->bb_insn_link).next;
                  }
                  ((MIR_module *)pgVar28)->data = bb_insn_00;
                  (bb_insn_00->bb_insn_link).next = (bb_insn_t)0x0;
                  (bb_insn_00->bb_insn_link).prev = pbVar4;
                  pgStack_e0->temp_bitmap2 = (bitmap_t)bb_insn_00;
                }
                else {
                  pcStack_f8 = (code *)0x168e23;
                  DLIST_bb_insn_t_insert_before
                            ((DLIST_bb_insn_t *)pgVar28,(bb_insn_t_conflict)pgStack_e8,bb_insn_00);
                  pgVar13 = pgVar33;
                }
                pgVar28 = pgStack_e0;
                pcStack_f8 = (code *)0x168e8d;
                MIR_insert_insn_before
                          (pMStack_c0,gen_ctx_00->curr_func_item,(MIR_insn_t_conflict)pgVar13->ctx,
                           (MIR_insn_t_conflict)pgStack_d0);
                bb_insn_00->bb = (bb_t_conflict)pgVar28;
                uStack_d4 = 1;
                pgVar28 = (gen_ctx *)pbStack_b0->insn;
                goto LAB_00168ea2;
              }
              if ((bb_insn_t_conflict)pgVar19->temp_bitmap2 == bb_insn_00) {
                pDVar25 = (DLIST_LINK_bb_insn_t *)&pgVar19->temp_bitmap2;
                goto LAB_00168dd3;
              }
            }
            pcStack_f8 = (code *)0x168f2f;
            loop_licm_cold_5();
            goto LAB_00168f2f;
          }
LAB_00168ea2:
          pgVar14 = (gen_ctx *)((long)&pgVar14->ctx + 1);
          bb_insn_00 = pbStack_b0;
        } while (pgVar14 < pgVar28);
      }
      return;
    }
  }
  pcStack_f8 = (code *)0x168f3e;
  loop_licm_cold_10();
LAB_00168f3e:
  pcStack_f8 = DLIST_bb_t_insert_before;
  loop_licm_cold_7();
  if (((gen_ctx_01 == (gen_ctx *)0x0) || ((gen_ctx *)pcVar32 == (gen_ctx *)0x0)) ||
     (*(c2mir_ctx **)&gen_ctx_01->optimize_level == (c2mir_ctx *)0x0)) {
    pcStack_100 = (code *)0x168f97;
    DLIST_bb_t_insert_before_cold_3();
LAB_00168f97:
    pcStack_100 = (code *)0x168f9c;
    DLIST_bb_t_insert_before_cold_1();
  }
  else {
    pVVar8 = *(VARR_size_t **)&((gen_ctx *)pcVar32)->debug_level;
    pgVar19 = (gen_ctx *)gen_ctx_01->ctx;
    if (pVVar8 != (VARR_size_t *)0x0) {
      if (pgVar19 != (gen_ctx *)0x0) {
        pVVar8[1].varr = (size_t *)extraout_RDX;
        *(VARR_size_t **)&extraout_RDX->debug_level = pVVar8;
        *(gen_ctx **)&((gen_ctx *)pcVar32)->debug_level = extraout_RDX;
        extraout_RDX->to_free = (VARR_void_ptr_t *)pcVar32;
        return;
      }
      goto LAB_00168f97;
    }
    if (pgVar19 == (gen_ctx *)pcVar32) {
      *(gen_ctx **)&((gen_ctx *)pcVar32)->debug_level = extraout_RDX;
      extraout_RDX->to_free = (VARR_void_ptr_t *)pcVar32;
      *(undefined8 *)&extraout_RDX->debug_level = 0;
      gen_ctx_01->ctx = (MIR_context_t)extraout_RDX;
      return;
    }
  }
  pcStack_100 = DLIST_loop_node_t_insert_after;
  DLIST_bb_t_insert_before_cold_2();
  if (((gen_ctx_01 == (gen_ctx *)0x0) || ((gen_ctx *)pcVar32 == (gen_ctx *)0x0)) ||
     ((gen_ctx *)gen_ctx_01->ctx == (gen_ctx *)0x0)) {
    pgStack_108 = (gen_ctx *)0x168ff6;
    DLIST_loop_node_t_insert_after_cold_3();
  }
  else {
    pVVar9 = ((gen_ctx *)pcVar32)->addr_regs;
    pgVar19 = *(gen_ctx **)&gen_ctx_01->optimize_level;
    if (pVVar9 == (bitmap_t)0x0) {
      if (pgVar19 == (gen_ctx *)pcVar32) {
        ((gen_ctx *)pcVar32)->addr_regs = extraout_RDX_00;
        extraout_RDX_00[2].size = (size_t)pcVar32;
        extraout_RDX_00[2].varr = (bitmap_el_t *)0x0;
        *(bitmap_t *)&gen_ctx_01->optimize_level = extraout_RDX_00;
        return;
      }
      goto LAB_00168ffb;
    }
    if (pgVar19 != (gen_ctx *)0x0) {
      pVVar9[2].size = (size_t)extraout_RDX_00;
      extraout_RDX_00[2].varr = &pVVar9->els_num;
      ((gen_ctx *)pcVar32)->addr_regs = extraout_RDX_00;
      extraout_RDX_00[2].size = (size_t)pcVar32;
      return;
    }
  }
  pgStack_108 = (gen_ctx *)0x168ffb;
  DLIST_loop_node_t_insert_after_cold_1();
LAB_00168ffb:
  pgStack_108 = (gen_ctx *)loop_invariant_p;
  DLIST_loop_node_t_insert_after_cold_2();
  uVar30 = *(ulong *)(extraout_RDX_01 + 6);
  uVar18 = (uint)uVar30;
  if ((((uVar18 - 0xa5 < 0xffffffd1) &&
       ((0x14 < uVar18 - 0xa6 || ((0x104071U >> (uVar18 - 0xa6 & 0x1f) & 1) == 0)))) &&
      (uVar18 - 0xaa < 0xfffffffd)) &&
     (((0x3b < uVar18 || ((0xf1e000000000000U >> (uVar30 & 0x3f) & 1) == 0)) && (6 < uVar18 - 0xad))
     )) {
    pgStack_130 = gen_ctx_00;
    pbStack_128 = bb_insn_00;
    pgStack_120 = pgVar14;
    pgStack_118 = loop_00;
    pgStack_110 = pgVar13;
    pgStack_108 = pgVar28;
    if (uVar30 >> 0x20 == 0) {
      iStack_150.nops = 0;
    }
    else {
      uVar26 = 0;
      puVar10 = extraout_RDX_01;
      do {
        if ((char)puVar10[10] == '\x02') {
          uStack_158 = uVar26;
          iVar11 = bitmap_bit_p(gen_ctx_01->tied_regs,(ulong)puVar10[0xc]);
          if (iVar11 != 0) {
            return;
          }
          uVar30 = *(ulong *)(extraout_RDX_01 + 6);
          uVar26 = uStack_158;
        }
        else if ((char)puVar10[10] == '\v') {
          return;
        }
        uVar26 = uVar26 + 1;
        iStack_150.nops = uVar30 >> 0x20;
        puVar10 = puVar10 + 0xc;
      } while (uVar26 < iStack_150.nops);
    }
    iStack_150.op_num = 0;
    iStack_150.op_part_num = 0;
    iVar11 = input_insn_var_iterator_next(gen_ctx_01,&iStack_150,&MStack_15c,&iStack_160);
    if (iVar11 != 0) {
      do {
        if (*(long *)(extraout_RDX_01 + (long)iStack_160 * 0xc + 8) == 0) {
          __assert_fail("se != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x14bf,"int loop_invariant_p(gen_ctx_t, loop_node_t, bb_insn_t, bitmap_t)")
          ;
        }
        lVar34 = *(long *)(*(long *)(extraout_RDX_01 + (long)iStack_160 * 0xc + 8) + 8);
        if (pgVar19 == (gen_ctx *)0x0) {
LAB_00169157:
          pgVar13 = (gen_ctx *)pcVar32;
          do {
            pgVar13 = (gen_ctx *)pgVar13->debug_file;
            if (pgVar13 == (gen_ctx *)0x0) {
              return;
            }
          } while (pgVar13 != *(gen_ctx **)(*(long *)(*(long *)(lVar34 + 0x30) + 0x98) + 0x18));
        }
        else {
          uVar18 = *(uint *)(lVar34 + 0xc);
          if (((ulong)((long)pgVar19->ctx << 6) <= (ulong)uVar18) ||
             (((ulong)(&pgVar19->curr_func_item->data)[uVar18 >> 6] >> ((ulong)uVar18 & 0x3f) & 1)
              == 0)) goto LAB_00169157;
        }
        iVar11 = input_insn_var_iterator_next(gen_ctx_01,&iStack_150,&MStack_15c,&iStack_160);
      } while (iVar11 != 0);
    }
  }
  return;
  while (pgVar13 = (gen_ctx *)((long)&pgStack_b8->ctx + 1), pgVar13 < (ulong)auStack_a4._12_8_) {
LAB_00168b61:
    pcStack_f8 = (code *)0x168b78;
    pgStack_b8 = pgVar13;
    MIR_insn_op_mode(gen_ctx_00->ctx,pMStack_90,(size_t)pgVar13,(int *)(auStack_a4 + 8));
    if (auStack_a4._8_4_ != 0) {
      if (pMStack_80[(long)pgStack_b8].field_0x8 == '\x02') {
        plVar17 = *(long **)(*plStack_78 + 0x20 + (long)(int)pgStack_b8 * 0x30);
        if (plVar17 != (long *)0x0) {
          do {
            uVar18 = *(uint *)(*plVar17 + 0xc);
            if (((ulong)((long)pgStack_e8->ctx << 6) <= (ulong)uVar18) ||
               (((ulong)(&pgStack_e8->curr_func_item->data)[uVar18 >> 6] >> ((ulong)uVar18 & 0x3f) &
                1) == 0)) {
              bVar35 = false;
              iVar11 = 1;
              goto LAB_00168c1f;
            }
            plVar17 = (long *)plVar17[4];
          } while (plVar17 != (long *)0x0);
        }
      }
      else if (pMStack_80[(long)pgStack_b8].field_0x8 != '\v') goto LAB_00168ed3;
    }
  }
LAB_00168b36:
  uVar26 = uVar23 + 1;
  pgVar13 = (gen_ctx *)&DAT_00000001;
  if (uVar30 <= nop) goto LAB_00168c1c;
  goto LAB_00168a1b;
LAB_00168ece:
  pcStack_f8 = (code *)0x168ed3;
  loop_licm_cold_1();
LAB_00168ed3:
  pcStack_f8 = (code *)0x168ef2;
  __assert_fail("op_ref->mode == MIR_OP_VAR",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x4ff,
                "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
               );
}

Assistant:

static void licm_add_loop_preheaders (gen_ctx_t gen_ctx, loop_node_t loop) {
  int subloop_p = FALSE;
  bb_insn_t bb_insn;
  edge_t e;

  for (loop_node_t node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) {
      subloop_p = TRUE;
      licm_add_loop_preheaders (gen_ctx, node); /* process sub-loops */
    }
  /* See loop_licm where we process only the nested loops: */
  if (subloop_p || loop == curr_cfg->root_loop_node) return;
  loop->u.preheader = NULL;
  if ((e = find_loop_entry_edge (loop->entry->bb)) == NULL) return;
  if ((bb_insn = DLIST_TAIL (bb_insn_t, e->src->bb_insns)) == NULL || bb_insn->insn->code == MIR_JMP
      || !MIR_any_branch_code_p (bb_insn->insn->code)) {
    loop->u.preheader = e->src->loop_node;      /* The preheader already exists */
    e->src->loop_node->u.preheader_loop = loop; /* The preheader already exists */
  } else {
    create_preheader_from_edge (gen_ctx, e, loop);
  }
}